

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
aeron::archive::AeronArchive::pollForErrorResponse_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,AeronArchive *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  Value VVar4;
  pointer pCVar5;
  int64_t iVar6;
  ulong uVar7;
  string *val;
  int in_ECX;
  nfds_t __nfds;
  pollfd *__fds;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  AeronArchive *this_local;
  
  __fds = (pollfd *)&this->lock_;
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,(mutex_type *)__fds)
  ;
  pCVar5 = std::
           unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
           ::operator->(&this->controlResponsePoller_);
  iVar3 = ControlResponsePoller::poll(pCVar5,__fds,__nfds,in_ECX);
  if (iVar3 != 0) {
    pCVar5 = std::
             unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
             ::operator->(&this->controlResponsePoller_);
    bVar1 = ControlResponsePoller::isPollComplete(pCVar5);
    if (bVar1) {
      pCVar5 = std::
               unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               ::operator->(&this->controlResponsePoller_);
      iVar6 = ControlResponsePoller::controlSessionId(pCVar5);
      if (iVar6 == this->controlSessionId_) {
        pCVar5 = std::
                 unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                 ::operator->(&this->controlResponsePoller_);
        uVar7 = ControlResponsePoller::templateId(pCVar5);
        uVar2 = io::aeron::archive::codecs::ControlResponse::sbeTemplateId();
        if (uVar7 == uVar2) {
          pCVar5 = std::
                   unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                   ::operator->(&this->controlResponsePoller_);
          VVar4 = ControlResponsePoller::code(pCVar5);
          if (VVar4 == ERROR) {
            pCVar5 = std::
                     unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ::operator->(&this->controlResponsePoller_);
            val = ControlResponsePoller::errorMessage_abi_cxx11_(pCVar5);
            boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::optional(__return_storage_ptr__,val);
            goto LAB_0019a311;
          }
        }
      }
    }
  }
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(__return_storage_ptr__);
LAB_0019a311:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<std::string> AeronArchive::pollForErrorResponse() {
    std::unique_lock<std::mutex> lock(lock_);

    if (controlResponsePoller_->poll() != 0 && controlResponsePoller_->isPollComplete()) {
        if (controlResponsePoller_->controlSessionId() == controlSessionId_ &&
            controlResponsePoller_->templateId() == codecs::ControlResponse::sbeTemplateId() &&
            controlResponsePoller_->code() == codecs::ControlResponseCode::ERROR) {
            return controlResponsePoller_->errorMessage();
        }
    }

    return {};
}